

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::indent(QWidgetTextControlPrivate *this)

{
  int iVar1;
  QTextBlock *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  pQVar2 = (QTextBlock *)QTextCursor::currentList();
  if (pQVar2 == (QTextBlock *)0x0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_48);
    iVar1 = QTextBlockFormat::indent((QTextBlockFormat *)&local_38);
    QTextBlockFormat::setIndent((QTextBlockFormat *)&local_48,iVar1 + 1);
    QTextCursor::mergeBlockFormat((QTextBlockFormat *)&this->cursor);
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextList::format((QTextList *)&local_48);
    iVar1 = QTextListFormat::indent((QTextListFormat *)&local_48);
    QTextListFormat::setIndent((QTextListFormat *)&local_48,iVar1 + 1);
    QTextCursor::block();
    iVar1 = QTextList::itemNumber(pQVar2);
    if (iVar1 == 1) {
      QTextObject::setFormat((QTextFormat *)pQVar2);
    }
    else {
      QTextCursor::createList((QTextListFormat *)&this->cursor);
    }
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextFormat::~QTextFormat((QTextFormat *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::indent()
{
    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextList *list = cursor.currentList();
    if (!list) {
        QTextBlockFormat modifier;
        modifier.setIndent(blockFmt.indent() + 1);
        cursor.mergeBlockFormat(modifier);
    } else {
        QTextListFormat format = list->format();
        format.setIndent(format.indent() + 1);

        if (list->itemNumber(cursor.block()) == 1)
            list->setFormat(format);
        else
            cursor.createList(format);
    }
}